

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cpp
# Opt level: O2

void __thiscall Edge::show(Edge *this)

{
  printf("[ ( %d, %d ) A{%d} chave = %d  modif = %d res = %.5f  reat = %.5f  fA = %.5f  fR = %.5f  peA = %.9f  peR = %.9f ]"
         ,this->resistance,this->reactance,this->activePowerFlow,this->reactivePowerFlow,
         this->activeLoss,this->reactiveLoss,(ulong)(uint)this->origin->id,
         (ulong)(uint)this->destiny->id,(ulong)(uint)this->id,(ulong)this->closed,
         (ulong)this->modifiable);
  return;
}

Assistant:

void Edge::show(){
    printf("[ ( %d, %d ) A{%d} chave = %d  modif = %d res = %.5f  reat = %.5f  fA = %.5f  fR = %.5f  peA = %.9f  peR = %.9f ]",
    this->origin->getID(), this->destiny->getID(), this->id, this->closed, this->modifiable, this->resistance, this->reactance,
    this->activePowerFlow, this->reactivePowerFlow, this->activeLoss, this->reactiveLoss);
}